

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modulator.cpp
# Opt level: O0

void anon_unknown.dwarf_14a0f7::Modulator_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  undefined4 *in_RDX;
  uint in_ESI;
  undefined4 *in_RDI;
  
  if (in_ESI == 1) {
    *in_RDX = *in_RDI;
  }
  else {
    if (in_ESI != 2) {
      this = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (this,0xa002,"Invalid modulator float property 0x%04x",(ulong)in_ESI);
      __cxa_throw(this,&effect_exception::typeinfo,effect_exception::~effect_exception);
    }
    *in_RDX = in_RDI[1];
  }
  return;
}

Assistant:

void Modulator_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_RING_MODULATOR_FREQUENCY:
        *val = props->Modulator.Frequency;
        break;
    case AL_RING_MODULATOR_HIGHPASS_CUTOFF:
        *val = props->Modulator.HighPassCutoff;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid modulator float property 0x%04x", param};
    }
}